

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-accept.c
# Opt level: O2

int run_test_tcp_close_accept(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uv_tcp_t *puVar4;
  long lVar5;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&tcp_server,2,connection_cb);
        if (iVar1 == 0) {
          puVar4 = tcp_outgoing;
          lVar5 = 0;
          do {
            if (lVar5 + 0x60 == 0x120) {
              uv_run(uVar2,0);
              if (got_connections == 2) {
                if (close_cb_called == 4) {
                  if (write_cb_called == 2) {
                    if (read_cb_called == 1) {
                      uVar2 = uv_default_loop();
                      uv_walk(uVar2,close_walk_cb,0);
                      uv_run(uVar2,0);
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      if (iVar1 == 0) {
                        uv_library_shutdown();
                        return 0;
                      }
                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                      uVar2 = 0xbe;
                    }
                    else {
                      pcVar3 = "1 == read_cb_called";
                      uVar2 = 0xbc;
                    }
                  }
                  else {
                    pcVar3 = "ARRAY_SIZE(tcp_outgoing) == write_cb_called";
                    uVar2 = 0xbb;
                  }
                }
                else {
                  pcVar3 = "(ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called";
                  uVar2 = 0xba;
                }
              }
              else {
                pcVar3 = "ARRAY_SIZE(tcp_outgoing) == got_connections";
                uVar2 = 0xb9;
              }
              goto LAB_0015c8e4;
            }
            iVar1 = uv_tcp_init(uVar2,puVar4);
            if (iVar1 != 0) {
              pcVar3 = "0 == uv_tcp_init(loop, client)";
              uVar2 = 0xb0;
              goto LAB_0015c8e4;
            }
            iVar1 = uv_tcp_connect((long)connect_reqs[0].reserved + lVar5 + -0x10,puVar4,&addr,
                                   connect_cb);
            puVar4 = puVar4 + 1;
            lVar5 = lVar5 + 0x60;
          } while (iVar1 == 0);
          pcVar3 = 
          "0 == uv_tcp_connect(&connect_reqs[i], client, (const struct sockaddr*) &addr, connect_cb)"
          ;
          uVar2 = 0xb4;
        }
        else {
          pcVar3 = 
          "0 == uv_listen((uv_stream_t*) &tcp_server, ARRAY_SIZE(tcp_outgoing), connection_cb)";
          uVar2 = 0xab;
        }
      }
      else {
        pcVar3 = "0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0)";
        uVar2 = 0xa8;
      }
    }
    else {
      pcVar3 = "0 == uv_tcp_init(loop, &tcp_server)";
      uVar2 = 0xa7;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xa5;
  }
LAB_0015c8e4:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-close-accept.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_accept) {
  unsigned int i;
  uv_loop_t* loop;
  uv_tcp_t* client;

  /*
   * A little explanation of what goes on below:
   *
   * We'll create server and connect to it using two clients, each writing one
   * byte once connected.
   *
   * When all clients will be accepted by server - we'll start reading from them
   * and, on first client's first byte, will close second client and server.
   * After that, we'll immediately initiate new connection to server using
   * tcp_check handle (thus, reusing fd from second client).
   *
   * In this situation uv__io_poll()'s event list should still contain read
   * event for second client, and, if not cleaned up properly, `tcp_check` will
   * receive stale event of second incoming and invoke `connect_cb` with zero
   * status.
   */

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(loop, &tcp_server));
  ASSERT(0 == uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &tcp_server,
                        ARRAY_SIZE(tcp_outgoing),
                        connection_cb));

  for (i = 0; i < ARRAY_SIZE(tcp_outgoing); i++) {
    client = tcp_outgoing + i;

    ASSERT(0 == uv_tcp_init(loop, client));
    ASSERT(0 == uv_tcp_connect(&connect_reqs[i],
                               client,
                               (const struct sockaddr*) &addr,
                               connect_cb));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(ARRAY_SIZE(tcp_outgoing) == got_connections);
  ASSERT((ARRAY_SIZE(tcp_outgoing) + 2) == close_cb_called);
  ASSERT(ARRAY_SIZE(tcp_outgoing) == write_cb_called);
  ASSERT(1 == read_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}